

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O0

void CreateBackwardReferencesNH5
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command_conflict *commands,
               size_t *num_commands,size_t *num_literals,
               BackwardReferenceFromDecoder *backward_references,size_t *back_refs_position,
               size_t back_refs_size)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  size_t sVar4;
  uint16_t *puVar5;
  uint32_t *puVar6;
  HasherCommon *pHVar7;
  Command_conflict *pCVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint32_t uVar13;
  uint8_t *puVar14;
  uint8_t *puVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  uint8_t *puVar20;
  BrotliTransforms *pBVar21;
  size_t sVar22;
  uint8_t *puVar23;
  long lVar24;
  byte bVar25;
  uint uVar26;
  int *piVar27;
  uint8_t *puVar28;
  BrotliEncoderDictionary *pBVar29;
  bool bVar30;
  uint8_t *local_f28;
  uint8_t *local_f18;
  uint8_t *local_f08;
  uint8_t *local_f00;
  uint8_t *local_ef0;
  uint8_t *local_ed8;
  ulong local_ed0;
  uint8_t *local_ec0;
  uint8_t *local_eb8;
  ulong local_eb0;
  ulong local_ea8;
  ulong local_ea0;
  uint8_t *local_e90;
  uint8_t *local_e88;
  uint8_t *local_e80;
  size_t pos_jump_1;
  size_t kMargin_1;
  size_t pos_jump;
  size_t kMargin;
  size_t range_end;
  size_t range_start;
  size_t distance_code;
  HasherSearchResult sr2;
  size_t cost_diff_lazy;
  size_t sStack_e10;
  int delayed_backward_references_in_row;
  HasherSearchResult sr;
  size_t dictionary_start;
  size_t max_distance;
  size_t max_length;
  size_t kMinScore;
  size_t gap;
  size_t apply_random_heuristics;
  size_t random_heuristics_window_size;
  size_t store_end;
  size_t pos_end;
  size_t insert_length;
  Command_conflict *orig_commands;
  size_t position_offset;
  size_t max_backward_limit;
  H5 *privat;
  BrotliEncoderParams *params_local;
  ContextLut literal_context_lut_local;
  size_t ringbuffer_mask_local;
  uint8_t *ringbuffer_local;
  size_t position_local;
  size_t num_bytes_local;
  size_t offset1;
  size_t offset0;
  size_t distance_plus_3;
  ulong local_c78;
  uint32_t delta;
  size_t nbits;
  size_t offset_4;
  size_t prefix;
  size_t postfix;
  size_t postfix_mask;
  size_t bucket_2;
  size_t dist;
  uint16_t copycode;
  uint16_t inscode;
  uint32_t nbits_1;
  ushort local_b62;
  uint32_t nbits_2;
  ushort local_b3a;
  uint32_t offset_5;
  uint16_t bits64;
  ushort local_b12;
  int is_ok_1;
  size_t score_7;
  size_t len_5;
  size_t backward_6;
  size_t prev_ix_5;
  size_t down_1;
  uint32_t *bucket_1;
  ulong uStack_ab0;
  uint32_t key_2;
  size_t score_6;
  size_t len_4;
  size_t prev_ix_4;
  size_t backward_5;
  size_t i_2;
  size_t best_len_1;
  size_t best_score_1;
  size_t min_score_1;
  size_t cur_ix_masked_1;
  uint32_t *buckets_1;
  uint16_t *num_1;
  size_t matching_bits_6;
  uint64_t x_6;
  size_t limit2_6;
  size_t matched_6;
  ulong *local_9c0;
  size_t local_9b0;
  size_t matching_bits_5;
  uint64_t x_5;
  size_t limit2_5;
  size_t matched_5;
  ulong *local_980;
  size_t local_970;
  ulong uStack_948;
  int item_matches_1;
  size_t i_3;
  size_t key_3;
  uint32_t h_1;
  size_t transform_id_1;
  size_t cut_1;
  size_t score_8;
  size_t backward_7;
  size_t matchlen_2;
  size_t offset_2;
  size_t matching_bits_7;
  uint64_t x_7;
  size_t limit2_7;
  size_t matched_7;
  ulong *local_800;
  size_t local_7f0;
  int is_ok;
  size_t score_2;
  size_t len_2;
  size_t backward_2;
  size_t prev_ix_2;
  size_t down;
  uint32_t *bucket;
  ulong uStack_768;
  uint32_t key;
  size_t score_1;
  size_t len_1;
  size_t prev_ix_1;
  size_t backward_1;
  size_t i;
  size_t best_len;
  size_t best_score;
  size_t min_score;
  size_t cur_ix_masked;
  uint32_t *buckets;
  uint16_t *num;
  size_t matching_bits_2;
  uint64_t x_2;
  size_t limit2_2;
  size_t matched_2;
  ulong *local_678;
  size_t local_668;
  size_t matching_bits_1;
  uint64_t x_1;
  size_t limit2_1;
  size_t matched_1;
  ulong *local_638;
  size_t local_628;
  ulong uStack_600;
  int item_matches;
  size_t i_1;
  size_t key_1;
  uint32_t h;
  size_t transform_id;
  size_t cut;
  size_t score_3;
  size_t backward_3;
  size_t matchlen;
  size_t offset;
  size_t matching_bits_3;
  uint64_t x_3;
  size_t limit2_3;
  size_t matched_3;
  ulong *local_4b8;
  size_t local_4a8;
  uint8_t *local_460;
  size_t i_4;
  size_t offset_6;
  size_t minor_ix;
  uint32_t key_4;
  size_t offset_8;
  size_t minor_ix_2;
  uint32_t key_6;
  size_t offset_7;
  size_t minor_ix_1;
  uint32_t key_5;
  int next_last_distance;
  int last_distance;
  int next_last_distance_1;
  int last_distance_1;
  size_t score;
  size_t len;
  size_t prev_ix;
  size_t backward;
  size_t matching_bits;
  uint64_t x;
  size_t limit2;
  size_t matched;
  ulong *local_2c8;
  size_t local_2b8;
  size_t score_5;
  size_t len_3;
  size_t prev_ix_3;
  size_t backward_4;
  size_t matching_bits_4;
  uint64_t x_4;
  size_t limit2_4;
  size_t matched_4;
  ulong *local_1e8;
  size_t local_1d8;
  size_t score_4;
  size_t matchlen_1;
  uint8_t *string;
  BrotliTransforms *transforms;
  uint8_t *word;
  int transform_idx;
  int word_idx;
  int mask;
  uint32_t shift;
  size_t offset_1;
  BrotliDictionary *words;
  int address;
  size_t score_9;
  size_t matchlen_3;
  uint8_t *string_1;
  BrotliTransforms *transforms_1;
  uint8_t *word_1;
  int transform_idx_1;
  int word_idx_1;
  int mask_1;
  uint32_t shift_1;
  size_t offset_3;
  BrotliDictionary *words_1;
  int address_1;
  
  pCVar8 = commands;
  puVar14 = (uint8_t *)((1L << ((byte)params->lgwin & 0x3f)) - 0x10);
  sVar4 = params->stream_offset;
  pos_end = *last_insert_len;
  puVar15 = (uint8_t *)(position + num_bytes);
  local_e80 = (uint8_t *)position;
  if (3 < num_bytes) {
    local_e80 = (uint8_t *)((position + num_bytes) - 3);
  }
  iVar12 = 0x200;
  if (params->quality < 9) {
    iVar12 = 0x40;
  }
  lVar16 = (long)iVar12;
  gap = position + lVar16;
  iVar12 = (hasher->privat)._H5.num_last_distances_to_check_;
  puVar23 = (uint8_t *)position;
  if (4 < iVar12) {
    iVar10 = *dist_cache;
    dist_cache[4] = iVar10 + -1;
    dist_cache[5] = iVar10 + 1;
    dist_cache[6] = iVar10 + -2;
    dist_cache[7] = iVar10 + 2;
    dist_cache[8] = iVar10 + -3;
    dist_cache[9] = iVar10 + 3;
    puVar23 = (uint8_t *)position;
    if (10 < iVar12) {
      iVar12 = dist_cache[1];
      dist_cache[10] = iVar12 + -1;
      dist_cache[0xb] = iVar12 + 1;
      dist_cache[0xc] = iVar12 + -2;
      dist_cache[0xd] = iVar12 + 2;
      dist_cache[0xe] = iVar12 + -3;
      dist_cache[0xf] = iVar12 + 3;
      puVar23 = (uint8_t *)position;
    }
  }
LAB_0012d4d7:
  do {
    ringbuffer_local = puVar23;
    if (puVar15 <= ringbuffer_local + 4) {
      *last_insert_len = (size_t)(puVar15 + (pos_end - (long)ringbuffer_local));
      *num_commands = ((long)commands - (long)pCVar8 >> 4) + *num_commands;
      return;
    }
    max_distance = (long)puVar15 - (long)ringbuffer_local;
    local_e88 = puVar14;
    if (ringbuffer_local < puVar14) {
      local_e88 = ringbuffer_local;
    }
    local_e90 = puVar14;
    if (ringbuffer_local + sVar4 < puVar14) {
      local_e90 = ringbuffer_local + sVar4;
    }
    sr.len = 0;
    sr.distance = 0x7e4;
    sr.score = 0;
    pBVar29 = &params->dictionary;
    puVar23 = (uint8_t *)(params->dist).max_distance;
    puVar5 = (hasher->privat)._H5.num_;
    puVar6 = (hasher->privat)._H5.buckets_;
    uVar17 = (ulong)ringbuffer_local & ringbuffer_mask;
    best_len = 0x7e4;
    i = 0;
    sStack_e10 = 0;
    sr.score._0_4_ = 0;
    while( true ) {
      bVar30 = false;
      if (*back_refs_position < back_refs_size) {
        bVar30 = (uint8_t *)(long)backward_references[*back_refs_position].position <
                 ringbuffer_local;
      }
      if (!bVar30) break;
      *back_refs_position = *back_refs_position + 1;
    }
    if (((back_refs_size == 0) || (back_refs_size <= *back_refs_position)) ||
       ((uint8_t *)(long)backward_references[*back_refs_position].position != ringbuffer_local)) {
      for (backward_1 = 0;
          backward_1 < (ulong)(long)(hasher->privat)._H5.num_last_distances_to_check_;
          backward_1 = backward_1 + 1) {
        puVar28 = (uint8_t *)(long)dist_cache[backward_1];
        if (((ringbuffer_local + -(long)puVar28 < ringbuffer_local) && (puVar28 <= local_e88)) &&
           ((uVar18 = ringbuffer_mask & (ulong)(ringbuffer_local + -(long)puVar28),
            uVar17 + i <= ringbuffer_mask &&
            ((uVar18 + i <= ringbuffer_mask && (ringbuffer[uVar17 + i] == ringbuffer[uVar18 + i]))))
           )) {
          local_638 = (ulong *)(ringbuffer + uVar17);
          limit2_1 = 0;
          x_1 = (max_distance >> 3) + 1;
LAB_0012dd60:
          x_1 = x_1 - 1;
          if (x_1 != 0) {
            if (*local_638 == *(ulong *)(ringbuffer + limit2_1 + uVar18)) goto LAB_0012ddc2;
            iVar12 = 0;
            for (uVar18 = *local_638 ^ *(ulong *)(ringbuffer + limit2_1 + uVar18); (uVar18 & 1) == 0
                ; uVar18 = uVar18 >> 1 | 0x8000000000000000) {
              iVar12 = iVar12 + 1;
            }
            local_628 = ((ulong)(long)iVar12 >> 3) + limit2_1;
            goto LAB_0012df03;
          }
          matched_1 = (max_distance & 7) + 1;
          while (matched_1 = matched_1 - 1, matched_1 != 0) {
            if (ringbuffer[limit2_1 + uVar18] != (uint8_t)*local_638) {
              local_628 = limit2_1;
              goto LAB_0012df03;
            }
            local_638 = (ulong *)((long)local_638 + 1);
            limit2_1 = limit2_1 + 1;
          }
          local_628 = limit2_1;
LAB_0012df03:
          score_1 = local_628;
          if (((back_refs_size != 0) && (*back_refs_position < back_refs_size)) &&
             ((uint8_t *)(long)backward_references[*back_refs_position].position <
              ringbuffer_local + local_628)) {
            score_1 = (long)backward_references[*back_refs_position].position -
                      (long)ringbuffer_local;
          }
          if (((2 < score_1) || ((score_1 == 2 && (backward_1 < 2)))) &&
             (uStack_768 = score_1 * 0x87 + 0x78f, best_len < uStack_768)) {
            if (backward_1 != 0) {
              uStack_768 = uStack_768 -
                           ((long)(int)(0x1ca10 >> ((byte)backward_1 & 0xe) & 0xe) + 0x27);
            }
            if (best_len < uStack_768) {
              best_len = uStack_768;
              i = score_1;
              sStack_e10 = score_1;
              sr.distance = uStack_768;
              sr.len = (size_t)puVar28;
            }
          }
        }
      }
      uVar13 = HashBytesH5(ringbuffer + uVar17,(hasher->privat)._H5.hash_shift_);
      uVar26 = uVar13 << ((byte)*(undefined4 *)&(hasher->privat)._H35.hb.table & 0x1f);
      if ((hasher->privat)._H2.buckets_ < (uint32_t *)(ulong)puVar5[uVar13]) {
        local_ea0 = (ulong)puVar5[uVar13] - (hasher->privat)._H5.block_size_;
      }
      else {
        local_ea0 = 0;
      }
      backward_1 = (size_t)puVar5[uVar13];
      while (local_ea0 < backward_1) {
        backward_1 = backward_1 - 1;
        uVar18 = (ulong)puVar6[(ulong)uVar26 + (backward_1 & (hasher->privat)._H5.block_mask_)];
        puVar28 = ringbuffer_local + -uVar18;
        if (local_e88 < puVar28) break;
        uVar18 = ringbuffer_mask & uVar18;
        if (((uVar17 + i <= ringbuffer_mask) && (uVar18 + i <= ringbuffer_mask)) &&
           (ringbuffer[uVar17 + i] == ringbuffer[uVar18 + i])) {
          local_678 = (ulong *)(ringbuffer + uVar17);
          limit2_2 = 0;
          x_2 = (max_distance >> 3) + 1;
LAB_0012e2bc:
          x_2 = x_2 - 1;
          if (x_2 != 0) {
            if (*local_678 == *(ulong *)(ringbuffer + limit2_2 + uVar18)) goto LAB_0012e31e;
            iVar12 = 0;
            for (uVar18 = *local_678 ^ *(ulong *)(ringbuffer + limit2_2 + uVar18); (uVar18 & 1) == 0
                ; uVar18 = uVar18 >> 1 | 0x8000000000000000) {
              iVar12 = iVar12 + 1;
            }
            local_668 = ((ulong)(long)iVar12 >> 3) + limit2_2;
            goto LAB_0012e45f;
          }
          matched_2 = (max_distance & 7) + 1;
          while (matched_2 = matched_2 - 1, matched_2 != 0) {
            if (ringbuffer[limit2_2 + uVar18] != (uint8_t)*local_678) {
              local_668 = limit2_2;
              goto LAB_0012e45f;
            }
            local_678 = (ulong *)((long)local_678 + 1);
            limit2_2 = limit2_2 + 1;
          }
          local_668 = limit2_2;
LAB_0012e45f:
          score_2 = local_668;
          if (((back_refs_size != 0) && (*back_refs_position < back_refs_size)) &&
             ((uint8_t *)(long)backward_references[*back_refs_position].position <
              ringbuffer_local + local_668)) {
            score_2 = (long)backward_references[*back_refs_position].position -
                      (long)ringbuffer_local;
          }
          if (3 < score_2) {
            iVar12 = 0x1f;
            if ((uint)puVar28 != 0) {
              for (; (uint)puVar28 >> iVar12 == 0; iVar12 = iVar12 + -1) {
              }
            }
            uVar18 = (score_2 * 0x87 + 0x780) - (ulong)(uint)(iVar12 * 0x1e);
            if (best_len < uVar18) {
              i = score_2;
              sStack_e10 = score_2;
              sr.len = (size_t)puVar28;
              sr.distance = uVar18;
              best_len = uVar18;
            }
          }
        }
      }
      puVar6[(ulong)uVar26 + (ulong)((uint)puVar5[uVar13] & (hasher->privat)._H5.block_mask_)] =
           (uint32_t)ringbuffer_local;
      puVar5[uVar13] = puVar5[uVar13] + 1;
LAB_0012e5fa:
      if (sr.distance == 0x7e4) {
        if (back_refs_size == 0) {
          pHVar7 = (hasher->privat)._H5.common_;
          piVar27 = (int *)(ringbuffer + uVar17);
          if (pHVar7->dict_num_lookups >> 7 <= pHVar7->dict_num_matches) {
            i_1 = (size_t)(((uint)(*piVar27 * 0x1e35a7bd) >> 0x12) << 1);
            for (uStack_600 = 0; uStack_600 < 2; uStack_600 = uStack_600 + 1) {
              pHVar7->dict_num_lookups = pHVar7->dict_num_lookups + 1;
              if ((params->dictionary).hash_table_lengths[i_1] != '\0') {
                bVar1 = (params->dictionary).hash_table_lengths[i_1];
                uVar18 = (ulong)bVar1;
                uVar17 = (ulong)(params->dictionary).hash_table_words[i_1];
                if (max_distance < uVar18) {
                  bVar30 = false;
                }
                else {
                  local_4b8 = (ulong *)(pBVar29->words->data +
                                       (ulong)pBVar29->words->offsets_by_length[uVar18] +
                                       uVar18 * uVar17);
                  limit2_3 = 0;
                  x_3 = (ulong)(bVar1 >> 3) + 1;
LAB_0012e8a0:
                  x_3 = x_3 - 1;
                  if (x_3 != 0) {
                    if (*local_4b8 == *(ulong *)((long)piVar27 + limit2_3)) goto LAB_0012e902;
                    iVar12 = 0;
                    for (uVar19 = *local_4b8 ^ *(ulong *)((long)piVar27 + limit2_3);
                        (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
                      iVar12 = iVar12 + 1;
                    }
                    local_4a8 = ((ulong)(long)iVar12 >> 3) + limit2_3;
                    goto LAB_0012ea43;
                  }
                  matched_3 = (uVar18 & 7) + 1;
                  while (matched_3 = matched_3 - 1, matched_3 != 0) {
                    if (*(char *)((long)piVar27 + limit2_3) != (char)*local_4b8) {
                      local_4a8 = limit2_3;
                      goto LAB_0012ea43;
                    }
                    local_4b8 = (ulong *)((long)local_4b8 + 1);
                    limit2_3 = limit2_3 + 1;
                  }
                  local_4a8 = limit2_3;
LAB_0012ea43:
                  if ((uVar18 < local_4a8 + (params->dictionary).cutoffTransformsCount) &&
                     (local_4a8 != 0)) {
                    puVar28 = local_e90 +
                              ((uVar18 - local_4a8) * 4 +
                               ((params->dictionary).cutoffTransforms >>
                                ((char)(uVar18 - local_4a8) * '\x06' & 0x3fU) & 0x3f) <<
                              (pBVar29->words->size_bits_by_length[uVar18] & 0x3f)) + uVar17 + 1;
                    if (puVar23 < puVar28) {
                      bVar30 = false;
                    }
                    else {
                      iVar12 = 0x1f;
                      if ((uint)puVar28 != 0) {
                        for (; (uint)puVar28 >> iVar12 == 0; iVar12 = iVar12 + -1) {
                        }
                      }
                      uVar17 = (local_4a8 * 0x87 + 0x780) - (ulong)(uint)(iVar12 * 0x1e);
                      if (uVar17 < sr.distance) {
                        bVar30 = false;
                      }
                      else {
                        sStack_e10 = local_4a8;
                        sr.score._0_4_ = (uint)bVar1 - (int)local_4a8;
                        bVar30 = true;
                        sr.len = (size_t)puVar28;
                        sr.distance = uVar17;
                      }
                    }
                  }
                  else {
                    bVar30 = false;
                  }
                }
                if (bVar30) {
                  pHVar7->dict_num_matches = pHVar7->dict_num_matches + 1;
                }
              }
              i_1 = i_1 + 1;
            }
          }
        }
        else if (((*back_refs_position < back_refs_size) &&
                 ((uint8_t *)(long)backward_references[*back_refs_position].position ==
                  ringbuffer_local)) &&
                (backward_references[*back_refs_position].max_distance <
                 backward_references[*back_refs_position].distance)) {
          uVar26 = backward_references[*back_refs_position].distance;
          iVar12 = backward_references[*back_refs_position].copy_len;
          if ((((int)uVar26 < 0x7ffffffd) && (3 < iVar12)) && (iVar12 < 0x19)) {
            uVar9 = (uVar26 - (int)local_e88) - 1;
            uVar3 = pBVar29->words->offsets_by_length[iVar12];
            bVar1 = pBVar29->words->size_bits_by_length[iVar12];
            uVar2 = kBitMask[bVar1];
            iVar10 = (int)uVar9 >> (bVar1 & 0x1f);
            if (iVar10 < (int)(params->dictionary).num_transforms) {
              puVar23 = pBVar29->words->data;
              pBVar21 = BrotliGetTransforms();
              puVar28 = (uint8_t *)malloc((long)iVar12 * 10);
              iVar10 = BrotliTransformDictionaryWord
                                 (puVar28,puVar23 + (long)(int)((uVar9 & uVar2) * iVar12) +
                                                    (ulong)uVar3,iVar12,pBVar21,iVar10);
              sVar22 = (size_t)iVar10;
              iVar11 = memcmp(ringbuffer + uVar17,puVar28,sVar22);
              if (iVar11 == 0) {
                iVar11 = 0x1f;
                if (uVar26 != 0) {
                  for (; uVar26 >> iVar11 == 0; iVar11 = iVar11 + -1) {
                  }
                }
                sr.distance = (sVar22 * 0x87 + 0x780) - (ulong)(uint)(iVar11 * 0x1e);
                sr.score._0_4_ = iVar12 - iVar10;
                sr.len = (size_t)(int)uVar26;
                sStack_e10 = sVar22;
              }
            }
          }
        }
      }
    }
    else {
      uVar26 = backward_references[*back_refs_position].distance;
      uVar18 = (ulong)(int)uVar26;
      if ((ringbuffer_local + -uVar18 < ringbuffer_local) &&
         (uVar18 <= (ulong)(long)backward_references[*back_refs_position].max_distance)) {
        uVar19 = ringbuffer_mask & (ulong)(ringbuffer_local + -uVar18);
        local_2c8 = (ulong *)(ringbuffer + uVar17);
        limit2 = 0;
        x = (max_distance >> 3) + 1;
LAB_0012d954:
        x = x - 1;
        if (x != 0) {
          if (*local_2c8 == *(ulong *)(ringbuffer + limit2 + uVar19)) goto LAB_0012d9b6;
          iVar12 = 0;
          for (uVar19 = *local_2c8 ^ *(ulong *)(ringbuffer + limit2 + uVar19); (uVar19 & 1) == 0;
              uVar19 = uVar19 >> 1 | 0x8000000000000000) {
            iVar12 = iVar12 + 1;
          }
          local_2b8 = ((ulong)(long)iVar12 >> 3) + limit2;
          goto LAB_0012daf7;
        }
        matched = (max_distance & 7) + 1;
        while (matched = matched - 1, matched != 0) {
          if (ringbuffer[limit2 + uVar19] != (uint8_t)*local_2c8) {
            local_2b8 = limit2;
            goto LAB_0012daf7;
          }
          local_2c8 = (ulong *)((long)local_2c8 + 1);
          limit2 = limit2 + 1;
        }
        local_2b8 = limit2;
LAB_0012daf7:
        score = local_2b8;
        if ((ulong)(long)backward_references[*back_refs_position].copy_len < local_2b8) {
          score = (size_t)backward_references[*back_refs_position].copy_len;
        }
        iVar12 = 0x1f;
        if (uVar26 != 0) {
          for (; uVar26 >> iVar12 == 0; iVar12 = iVar12 + -1) {
          }
        }
        sr.distance = (score * 0x87 + 0x780) - (ulong)(uint)(iVar12 * 0x1e);
        sStack_e10 = score;
        sr.len = uVar18;
      }
      if (sr.score._4_4_ == 0) goto LAB_0012e5fa;
    }
    if (0x7e4 < sr.distance) {
      cost_diff_lazy._4_4_ = 0;
      puVar23 = ringbuffer_local;
      if (sr.score._4_4_ == 0) {
        do {
          max_distance = max_distance - 1;
          if (params->quality < 5) {
            local_ea8 = sStack_e10 - 1;
            if (max_distance <= local_ea8) {
              local_ea8 = max_distance;
            }
            local_eb0 = local_ea8;
          }
          else {
            local_eb0 = 0;
          }
          sr2.len = 0;
          sr2.distance = 0x7e4;
          sr2.score._4_4_ = 0;
          local_eb8 = puVar14;
          if (ringbuffer_local + 1 < puVar14) {
            local_eb8 = ringbuffer_local + 1;
          }
          local_ec0 = puVar14;
          if (ringbuffer_local + sVar4 + 1 < puVar14) {
            local_ec0 = ringbuffer_local + sVar4 + 1;
          }
          pBVar29 = &params->dictionary;
          puVar28 = ringbuffer_local + 1;
          puVar23 = (uint8_t *)(params->dist).max_distance;
          puVar5 = (hasher->privat)._H5.num_;
          puVar6 = (hasher->privat)._H5.buckets_;
          uVar17 = (ulong)puVar28 & ringbuffer_mask;
          best_len_1 = 0x7e4;
          i_2 = local_eb0;
          distance_code = 0;
          sr2.score._0_4_ = 0;
          while( true ) {
            bVar30 = false;
            if (*back_refs_position < back_refs_size) {
              bVar30 = (uint8_t *)(long)backward_references[*back_refs_position].position < puVar28;
            }
            if (!bVar30) break;
            *back_refs_position = *back_refs_position + 1;
          }
          if (((back_refs_size == 0) || (back_refs_size <= *back_refs_position)) ||
             ((uint8_t *)(long)backward_references[*back_refs_position].position != puVar28)) {
            for (backward_5 = 0;
                backward_5 < (ulong)(long)(hasher->privat)._H5.num_last_distances_to_check_;
                backward_5 = backward_5 + 1) {
              puVar20 = (uint8_t *)(long)dist_cache[backward_5];
              if (((puVar28 + -(long)puVar20 < puVar28) && (puVar20 <= local_eb8)) &&
                 ((uVar18 = ringbuffer_mask & (ulong)(puVar28 + -(long)puVar20),
                  uVar17 + i_2 <= ringbuffer_mask &&
                  ((uVar18 + i_2 <= ringbuffer_mask &&
                   (ringbuffer[uVar17 + i_2] == ringbuffer[uVar18 + i_2])))))) {
                local_980 = (ulong *)(ringbuffer + uVar17);
                limit2_5 = 0;
                x_5 = (max_distance >> 3) + 1;
LAB_0012f935:
                x_5 = x_5 - 1;
                if (x_5 != 0) {
                  if (*local_980 == *(ulong *)(ringbuffer + limit2_5 + uVar18)) goto LAB_0012f997;
                  iVar12 = 0;
                  for (uVar18 = *local_980 ^ *(ulong *)(ringbuffer + limit2_5 + uVar18);
                      (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x8000000000000000) {
                    iVar12 = iVar12 + 1;
                  }
                  local_970 = ((ulong)(long)iVar12 >> 3) + limit2_5;
                  goto LAB_0012fad8;
                }
                matched_5 = (max_distance & 7) + 1;
                while (matched_5 = matched_5 - 1, matched_5 != 0) {
                  if (ringbuffer[limit2_5 + uVar18] != (uint8_t)*local_980) {
                    local_970 = limit2_5;
                    goto LAB_0012fad8;
                  }
                  local_980 = (ulong *)((long)local_980 + 1);
                  limit2_5 = limit2_5 + 1;
                }
                local_970 = limit2_5;
LAB_0012fad8:
                score_6 = local_970;
                if (((back_refs_size != 0) && (*back_refs_position < back_refs_size)) &&
                   ((uint8_t *)(long)backward_references[*back_refs_position].position <
                    puVar28 + local_970)) {
                  score_6 = (long)backward_references[*back_refs_position].position - (long)puVar28;
                }
                if (((2 < score_6) || ((score_6 == 2 && (backward_5 < 2)))) &&
                   (uStack_ab0 = score_6 * 0x87 + 0x78f, best_len_1 < uStack_ab0)) {
                  if (backward_5 != 0) {
                    uStack_ab0 = uStack_ab0 -
                                 ((long)(int)(0x1ca10 >> ((byte)backward_5 & 0xe) & 0xe) + 0x27);
                  }
                  if (best_len_1 < uStack_ab0) {
                    best_len_1 = uStack_ab0;
                    i_2 = score_6;
                    distance_code = score_6;
                    sr2.distance = uStack_ab0;
                    sr2.len = (size_t)puVar20;
                  }
                }
              }
            }
            uVar13 = HashBytesH5(ringbuffer + uVar17,(hasher->privat)._H5.hash_shift_);
            uVar26 = uVar13 << ((byte)*(undefined4 *)&(hasher->privat)._H35.hb.table & 0x1f);
            if ((hasher->privat)._H2.buckets_ < (uint32_t *)(ulong)puVar5[uVar13]) {
              local_ed0 = (ulong)puVar5[uVar13] - (hasher->privat)._H5.block_size_;
            }
            else {
              local_ed0 = 0;
            }
            backward_5 = (size_t)puVar5[uVar13];
            while (local_ed0 < backward_5) {
              backward_5 = backward_5 - 1;
              uVar18 = (ulong)puVar6[(ulong)uVar26 + (backward_5 & (hasher->privat)._H5.block_mask_)
                                    ];
              puVar20 = puVar28 + -uVar18;
              if (local_eb8 < puVar20) break;
              uVar18 = ringbuffer_mask & uVar18;
              if (((uVar17 + i_2 <= ringbuffer_mask) && (uVar18 + i_2 <= ringbuffer_mask)) &&
                 (ringbuffer[uVar17 + i_2] == ringbuffer[uVar18 + i_2])) {
                local_9c0 = (ulong *)(ringbuffer + uVar17);
                limit2_6 = 0;
                x_6 = (max_distance >> 3) + 1;
LAB_0012fe91:
                x_6 = x_6 - 1;
                if (x_6 != 0) {
                  if (*local_9c0 == *(ulong *)(ringbuffer + limit2_6 + uVar18)) goto LAB_0012fef3;
                  iVar12 = 0;
                  for (uVar18 = *local_9c0 ^ *(ulong *)(ringbuffer + limit2_6 + uVar18);
                      (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x8000000000000000) {
                    iVar12 = iVar12 + 1;
                  }
                  local_9b0 = ((ulong)(long)iVar12 >> 3) + limit2_6;
                  goto LAB_00130034;
                }
                matched_6 = (max_distance & 7) + 1;
                while (matched_6 = matched_6 - 1, matched_6 != 0) {
                  if (ringbuffer[limit2_6 + uVar18] != (uint8_t)*local_9c0) {
                    local_9b0 = limit2_6;
                    goto LAB_00130034;
                  }
                  local_9c0 = (ulong *)((long)local_9c0 + 1);
                  limit2_6 = limit2_6 + 1;
                }
                local_9b0 = limit2_6;
LAB_00130034:
                score_7 = local_9b0;
                if (((back_refs_size != 0) && (*back_refs_position < back_refs_size)) &&
                   ((uint8_t *)(long)backward_references[*back_refs_position].position <
                    puVar28 + local_9b0)) {
                  score_7 = (long)backward_references[*back_refs_position].position - (long)puVar28;
                }
                if (3 < score_7) {
                  iVar12 = 0x1f;
                  if ((uint)puVar20 != 0) {
                    for (; (uint)puVar20 >> iVar12 == 0; iVar12 = iVar12 + -1) {
                    }
                  }
                  uVar18 = (score_7 * 0x87 + 0x780) - (ulong)(uint)(iVar12 * 0x1e);
                  if (best_len_1 < uVar18) {
                    i_2 = score_7;
                    distance_code = score_7;
                    sr2.len = (size_t)puVar20;
                    sr2.distance = uVar18;
                    best_len_1 = uVar18;
                  }
                }
              }
            }
            puVar6[(ulong)uVar26 + (ulong)((uint)puVar5[uVar13] & (hasher->privat)._H5.block_mask_)]
                 = (uint32_t)puVar28;
            puVar5[uVar13] = puVar5[uVar13] + 1;
LAB_001301cf:
            if (sr2.distance == 0x7e4) {
              if (back_refs_size == 0) {
                pHVar7 = (hasher->privat)._H5.common_;
                piVar27 = (int *)(ringbuffer + uVar17);
                if (pHVar7->dict_num_lookups >> 7 <= pHVar7->dict_num_matches) {
                  i_3 = (size_t)(((uint)(*piVar27 * 0x1e35a7bd) >> 0x12) << 1);
                  for (uStack_948 = 0; uStack_948 < 2; uStack_948 = uStack_948 + 1) {
                    pHVar7->dict_num_lookups = pHVar7->dict_num_lookups + 1;
                    if ((params->dictionary).hash_table_lengths[i_3] != '\0') {
                      bVar1 = (params->dictionary).hash_table_lengths[i_3];
                      uVar18 = (ulong)bVar1;
                      uVar17 = (ulong)(params->dictionary).hash_table_words[i_3];
                      if (max_distance < uVar18) {
                        bVar30 = false;
                      }
                      else {
                        local_800 = (ulong *)(pBVar29->words->data +
                                             (ulong)pBVar29->words->offsets_by_length[uVar18] +
                                             uVar18 * uVar17);
                        limit2_7 = 0;
                        x_7 = (ulong)(bVar1 >> 3) + 1;
LAB_00130475:
                        x_7 = x_7 - 1;
                        if (x_7 != 0) {
                          if (*local_800 == *(ulong *)((long)piVar27 + limit2_7)) goto LAB_001304d7;
                          iVar12 = 0;
                          for (uVar19 = *local_800 ^ *(ulong *)((long)piVar27 + limit2_7);
                              (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
                            iVar12 = iVar12 + 1;
                          }
                          local_7f0 = ((ulong)(long)iVar12 >> 3) + limit2_7;
                          goto LAB_00130618;
                        }
                        matched_7 = (uVar18 & 7) + 1;
                        while (matched_7 = matched_7 - 1, matched_7 != 0) {
                          if (*(char *)((long)piVar27 + limit2_7) != (char)*local_800) {
                            local_7f0 = limit2_7;
                            goto LAB_00130618;
                          }
                          local_800 = (ulong *)((long)local_800 + 1);
                          limit2_7 = limit2_7 + 1;
                        }
                        local_7f0 = limit2_7;
LAB_00130618:
                        if ((uVar18 < local_7f0 + (params->dictionary).cutoffTransformsCount) &&
                           (local_7f0 != 0)) {
                          puVar28 = local_ec0 +
                                    ((uVar18 - local_7f0) * 4 +
                                     ((params->dictionary).cutoffTransforms >>
                                      ((char)(uVar18 - local_7f0) * '\x06' & 0x3fU) & 0x3f) <<
                                    (pBVar29->words->size_bits_by_length[uVar18] & 0x3f)) +
                                    uVar17 + 1;
                          if (puVar23 < puVar28) {
                            bVar30 = false;
                          }
                          else {
                            iVar12 = 0x1f;
                            if ((uint)puVar28 != 0) {
                              for (; (uint)puVar28 >> iVar12 == 0; iVar12 = iVar12 + -1) {
                              }
                            }
                            uVar17 = (local_7f0 * 0x87 + 0x780) - (ulong)(uint)(iVar12 * 0x1e);
                            if (uVar17 < sr2.distance) {
                              bVar30 = false;
                            }
                            else {
                              distance_code = local_7f0;
                              sr2.score._0_4_ = (uint)bVar1 - (int)local_7f0;
                              bVar30 = true;
                              sr2.len = (size_t)puVar28;
                              sr2.distance = uVar17;
                            }
                          }
                        }
                        else {
                          bVar30 = false;
                        }
                      }
                      if (bVar30) {
                        pHVar7->dict_num_matches = pHVar7->dict_num_matches + 1;
                      }
                    }
                    i_3 = i_3 + 1;
                  }
                }
              }
              else if (((*back_refs_position < back_refs_size) &&
                       ((uint8_t *)(long)backward_references[*back_refs_position].position ==
                        puVar28)) &&
                      (backward_references[*back_refs_position].max_distance <
                       backward_references[*back_refs_position].distance)) {
                uVar26 = backward_references[*back_refs_position].distance;
                iVar12 = backward_references[*back_refs_position].copy_len;
                if ((((int)uVar26 < 0x7ffffffd) && (3 < iVar12)) && (iVar12 < 0x19)) {
                  uVar9 = (uVar26 - (int)local_eb8) - 1;
                  uVar3 = pBVar29->words->offsets_by_length[iVar12];
                  bVar1 = pBVar29->words->size_bits_by_length[iVar12];
                  uVar2 = kBitMask[bVar1];
                  iVar10 = (int)uVar9 >> (bVar1 & 0x1f);
                  if (iVar10 < (int)(params->dictionary).num_transforms) {
                    puVar23 = pBVar29->words->data;
                    pBVar21 = BrotliGetTransforms();
                    puVar28 = (uint8_t *)malloc((long)iVar12 * 10);
                    iVar10 = BrotliTransformDictionaryWord
                                       (puVar28,puVar23 + (long)(int)((uVar9 & uVar2) * iVar12) +
                                                          (ulong)uVar3,iVar12,pBVar21,iVar10);
                    sVar22 = (size_t)iVar10;
                    iVar11 = memcmp(ringbuffer + uVar17,puVar28,sVar22);
                    if (iVar11 == 0) {
                      iVar11 = 0x1f;
                      if (uVar26 != 0) {
                        for (; uVar26 >> iVar11 == 0; iVar11 = iVar11 + -1) {
                        }
                      }
                      sr2.distance = (sVar22 * 0x87 + 0x780) - (ulong)(uint)(iVar11 * 0x1e);
                      sr2.score._0_4_ = iVar12 - iVar10;
                      sr2.len = (size_t)(int)uVar26;
                      distance_code = sVar22;
                    }
                  }
                }
                sr2.score._4_4_ = 1;
              }
            }
          }
          else {
            uVar26 = backward_references[*back_refs_position].distance;
            uVar18 = (ulong)(int)uVar26;
            if ((puVar28 + -uVar18 < puVar28) &&
               (uVar18 <= (ulong)(long)backward_references[*back_refs_position].max_distance)) {
              uVar19 = ringbuffer_mask & (ulong)(puVar28 + -uVar18);
              local_1e8 = (ulong *)(ringbuffer + uVar17);
              limit2_4 = 0;
              x_4 = (max_distance >> 3) + 1;
LAB_0012f529:
              x_4 = x_4 - 1;
              if (x_4 != 0) {
                if (*local_1e8 == *(ulong *)(ringbuffer + limit2_4 + uVar19)) goto LAB_0012f58b;
                iVar12 = 0;
                for (uVar19 = *local_1e8 ^ *(ulong *)(ringbuffer + limit2_4 + uVar19);
                    (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
                  iVar12 = iVar12 + 1;
                }
                local_1d8 = ((ulong)(long)iVar12 >> 3) + limit2_4;
                goto LAB_0012f6cc;
              }
              matched_4 = (max_distance & 7) + 1;
              while (matched_4 = matched_4 - 1, matched_4 != 0) {
                if (ringbuffer[limit2_4 + uVar19] != (uint8_t)*local_1e8) {
                  local_1d8 = limit2_4;
                  goto LAB_0012f6cc;
                }
                local_1e8 = (ulong *)((long)local_1e8 + 1);
                limit2_4 = limit2_4 + 1;
              }
              local_1d8 = limit2_4;
LAB_0012f6cc:
              score_5 = local_1d8;
              if ((ulong)(long)backward_references[*back_refs_position].copy_len < local_1d8) {
                score_5 = (size_t)backward_references[*back_refs_position].copy_len;
              }
              iVar12 = 0x1f;
              if (uVar26 != 0) {
                for (; uVar26 >> iVar12 == 0; iVar12 = iVar12 + -1) {
                }
              }
              sr2.distance = (score_5 * 0x87 + 0x780) - (ulong)(uint)(iVar12 * 0x1e);
              distance_code = score_5;
              sr2.score._4_4_ = 1;
              sr2.len = uVar18;
            }
            if (sr2.score._4_4_ == 0) goto LAB_001301cf;
          }
          if ((sr2.distance < sr.distance + 0xaf) &&
             (puVar23 = ringbuffer_local, sr2.score._4_4_ == 0)) break;
          puVar23 = ringbuffer_local + 1;
          pos_end = pos_end + 1;
          sStack_e10 = distance_code;
          sr.len = sr2.len;
          sr.distance = sr2.distance;
          sr.score = CONCAT44(sr2.score._4_4_,(int)sr2.score);
          if ((sr2.score._4_4_ != 0) ||
             ((cost_diff_lazy._4_4_ = cost_diff_lazy._4_4_ + 1, 3 < cost_diff_lazy._4_4_ ||
              (puVar28 = ringbuffer_local + 5, ringbuffer_local = puVar23, puVar15 <= puVar28))))
          break;
        } while( true );
      }
      ringbuffer_local = puVar23;
      gap = (size_t)(ringbuffer_local + lVar16 + sStack_e10 * 2);
      local_ed8 = puVar14;
      if (ringbuffer_local + sVar4 < puVar14) {
        local_ed8 = ringbuffer_local + sVar4;
      }
      if (local_ed8 < sr.len) {
LAB_00130e52:
        local_c78 = sr.len + 0xf;
      }
      else {
        uVar17 = (sr.len + 3) - (long)*dist_cache;
        uVar18 = (sr.len + 3) - (long)dist_cache[1];
        if (sr.len == (long)*dist_cache) {
          local_c78 = 0;
        }
        else if (sr.len == (long)dist_cache[1]) {
          local_c78 = 1;
        }
        else if (uVar17 < 7) {
          local_c78 = (ulong)(int)(0x9750468 >> ((byte)((uVar17 & 0x3fffffff) << 2) & 0x1f) & 0xf);
        }
        else if (uVar18 < 7) {
          local_c78 = (ulong)(int)(0xfdb1ace >> ((byte)((uVar18 & 0x3fffffff) << 2) & 0x1f) & 0xf);
        }
        else if (sr.len == (long)dist_cache[2]) {
          local_c78 = 2;
        }
        else {
          if (sr.len != (long)dist_cache[3]) goto LAB_00130e52;
          local_c78 = 3;
        }
      }
      if ((sr.len <= local_ed8) && (local_c78 != 0)) {
        dist_cache[3] = dist_cache[2];
        dist_cache[2] = dist_cache[1];
        dist_cache[1] = *dist_cache;
        *dist_cache = (int)sr.len;
        iVar12 = (hasher->privat)._H5.num_last_distances_to_check_;
        if (4 < iVar12) {
          iVar10 = *dist_cache;
          dist_cache[4] = iVar10 + -1;
          dist_cache[5] = iVar10 + 1;
          dist_cache[6] = iVar10 + -2;
          dist_cache[7] = iVar10 + 2;
          dist_cache[8] = iVar10 + -3;
          dist_cache[9] = iVar10 + 3;
          if (10 < iVar12) {
            iVar12 = dist_cache[1];
            dist_cache[10] = iVar12 + -1;
            dist_cache[0xb] = iVar12 + 1;
            dist_cache[0xc] = iVar12 + -2;
            dist_cache[0xd] = iVar12 + 2;
            dist_cache[0xe] = iVar12 + -3;
            dist_cache[0xf] = iVar12 + 3;
          }
        }
      }
      uVar13 = (uint32_t)pos_end;
      commands->insert_len_ = uVar13;
      commands->copy_len_ = (uint)sStack_e10 | (int)sr.score << 0x19;
      uVar26 = (params->dist).num_direct_distance_codes;
      uVar3 = (params->dist).distance_postfix_bits;
      if (local_c78 < (ulong)uVar26 + 0x10) {
        commands->dist_prefix_ = (uint16_t)local_c78;
        commands->dist_extra_ = 0;
      }
      else {
        bVar1 = (byte)uVar3;
        uVar17 = (1L << (bVar1 + 2 & 0x3f)) + ((local_c78 - 0x10) - (ulong)uVar26);
        iVar12 = 0x1f;
        if ((uint)uVar17 != 0) {
          for (; (uint)uVar17 >> iVar12 == 0; iVar12 = iVar12 + -1) {
          }
        }
        bVar25 = (byte)(iVar12 - 1U);
        uVar18 = uVar17 >> (bVar25 & 0x3f) & 1;
        lVar24 = (ulong)(iVar12 - 1U) - (ulong)uVar3;
        commands->dist_prefix_ =
             (short)lVar24 * 0x400 |
             (short)uVar26 + 0x10 + (short)((lVar24 + -1) * 2 + uVar18 << (bVar1 & 0x3f)) +
             ((ushort)uVar17 & (short)(1 << (bVar1 & 0x1f)) - 1U);
        commands->dist_extra_ =
             (uint32_t)(uVar17 - (uVar18 + 2 << (bVar25 & 0x3f)) >> (bVar1 & 0x3f));
      }
      iVar12 = (uint)sStack_e10 + (int)sr.score;
      uVar17 = (ulong)iVar12;
      if (pos_end < 6) {
        local_b62 = (ushort)pos_end;
      }
      else if (pos_end < 0x82) {
        iVar10 = 0x1f;
        if (uVar13 - 2 != 0) {
          for (; uVar13 - 2 >> iVar10 == 0; iVar10 = iVar10 + -1) {
          }
        }
        local_b62 = (short)(iVar10 + -1) * 2 + (short)(pos_end - 2 >> ((byte)(iVar10 + -1) & 0x3f))
                    + 2;
      }
      else if (pos_end < 0x842) {
        iVar10 = 0x1f;
        if (uVar13 - 0x42 != 0) {
          for (; uVar13 - 0x42 >> iVar10 == 0; iVar10 = iVar10 + -1) {
          }
        }
        local_b62 = (short)iVar10 + 10;
      }
      else if (pos_end < 0x1842) {
        local_b62 = 0x15;
      }
      else if (pos_end < 0x5842) {
        local_b62 = 0x16;
      }
      else {
        local_b62 = 0x17;
      }
      if (uVar17 < 10) {
        local_b3a = (short)iVar12 - 2;
      }
      else if (uVar17 < 0x86) {
        iVar10 = 0x1f;
        if (iVar12 - 6U != 0) {
          for (; iVar12 - 6U >> iVar10 == 0; iVar10 = iVar10 + -1) {
          }
        }
        local_b3a = (short)(iVar10 + -1) * 2 + (short)(uVar17 - 6 >> ((byte)(iVar10 + -1) & 0x3f)) +
                    4;
      }
      else if (uVar17 < 0x846) {
        iVar10 = 0x1f;
        if (iVar12 - 0x46U != 0) {
          for (; iVar12 - 0x46U >> iVar10 == 0; iVar10 = iVar10 + -1) {
          }
        }
        local_b3a = (short)iVar10 + 0xc;
      }
      else {
        local_b3a = 0x17;
      }
      local_b12 = local_b3a & 7 | (local_b62 & 7) << 3;
      if ((((commands->dist_prefix_ & 0x3ff) == 0) && (local_b62 < 8)) && (local_b3a < 0x10)) {
        if (7 < local_b3a) {
          local_b12 = local_b12 | 0x40;
        }
      }
      else {
        iVar12 = ((int)(uint)local_b3a >> 3) + ((int)(uint)local_b62 >> 3) * 3;
        local_b12 = (short)iVar12 * 0x40 + 0x40 +
                    ((ushort)(0x520d40 >> ((char)iVar12 * '\x02' & 0x1fU)) & 0xc0) | local_b12;
      }
      commands->cmd_prefix_ = local_b12;
      *num_literals = pos_end + *num_literals;
      pos_end = 0;
      range_end = (size_t)(ringbuffer_local + 2);
      local_ef0 = ringbuffer_local + sStack_e10;
      if (local_e80 <= local_ef0) {
        local_ef0 = local_e80;
      }
      if (sr.len < sStack_e10 >> 2) {
        local_f00 = ringbuffer_local + sr.len * -4 + sStack_e10;
        if (local_f00 < range_end) {
          local_f00 = (uint8_t *)range_end;
        }
        if (local_ef0 < local_f00) {
          local_f08 = local_ef0;
        }
        else {
          local_f08 = local_f00;
        }
        range_end = (size_t)local_f08;
      }
      for (local_460 = (uint8_t *)range_end; local_460 < local_ef0; local_460 = local_460 + 1) {
        uVar13 = HashBytesH5(ringbuffer + ((ulong)local_460 & ringbuffer_mask),
                             (hasher->privat)._H5.hash_shift_);
        (hasher->privat)._H5.buckets_
        [(ulong)((uint)(hasher->privat)._H5.num_[uVar13] & (hasher->privat)._H5.block_mask_) +
         (ulong)(uVar13 << ((byte)*(undefined4 *)&(hasher->privat)._H35.hb.table & 0x1f))] =
             (uint32_t)local_460;
        puVar5 = (hasher->privat)._H5.num_;
        puVar5[uVar13] = puVar5[uVar13] + 1;
      }
      commands = commands + 1;
      puVar23 = ringbuffer_local + sStack_e10;
      goto LAB_0012d4d7;
    }
    pos_end = pos_end + 1;
    puVar23 = ringbuffer_local + 1;
    if ((gap < puVar23) && (back_refs_size == 0)) {
      if ((uint8_t *)(gap + lVar16 * 4) < puVar23) {
        puVar28 = ringbuffer_local + 0x11;
        local_f18 = puVar15 + -4;
        ringbuffer_local = puVar23;
        if (puVar28 < local_f18) {
          local_f18 = puVar28;
        }
        for (; puVar23 = ringbuffer_local, ringbuffer_local < local_f18;
            ringbuffer_local = ringbuffer_local + 4) {
          uVar13 = HashBytesH5(ringbuffer + ((ulong)ringbuffer_local & ringbuffer_mask),
                               (hasher->privat)._H5.hash_shift_);
          (hasher->privat)._H5.buckets_
          [(ulong)((uint)(hasher->privat)._H5.num_[uVar13] & (hasher->privat)._H5.block_mask_) +
           (ulong)(uVar13 << ((byte)*(undefined4 *)&(hasher->privat)._H35.hb.table & 0x1f))] =
               (uint32_t)ringbuffer_local;
          puVar5 = (hasher->privat)._H5.num_;
          puVar5[uVar13] = puVar5[uVar13] + 1;
          pos_end = pos_end + 4;
        }
      }
      else {
        puVar28 = ringbuffer_local + 9;
        local_f28 = puVar15 + -3;
        ringbuffer_local = puVar23;
        if (puVar28 < local_f28) {
          local_f28 = puVar28;
        }
        for (; puVar23 = ringbuffer_local, ringbuffer_local < local_f28;
            ringbuffer_local = ringbuffer_local + 2) {
          uVar13 = HashBytesH5(ringbuffer + ((ulong)ringbuffer_local & ringbuffer_mask),
                               (hasher->privat)._H5.hash_shift_);
          (hasher->privat)._H5.buckets_
          [(ulong)((uint)(hasher->privat)._H5.num_[uVar13] & (hasher->privat)._H5.block_mask_) +
           (ulong)(uVar13 << ((byte)*(undefined4 *)&(hasher->privat)._H35.hb.table & 0x1f))] =
               (uint32_t)ringbuffer_local;
          puVar5 = (hasher->privat)._H5.num_;
          puVar5[uVar13] = puVar5[uVar13] + 1;
          pos_end = pos_end + 2;
        }
      }
    }
  } while( true );
LAB_0012ddc2:
  local_638 = local_638 + 1;
  limit2_1 = limit2_1 + 8;
  goto LAB_0012dd60;
LAB_0012e31e:
  local_678 = local_678 + 1;
  limit2_2 = limit2_2 + 8;
  goto LAB_0012e2bc;
LAB_0012d9b6:
  local_2c8 = local_2c8 + 1;
  limit2 = limit2 + 8;
  goto LAB_0012d954;
LAB_0012e902:
  local_4b8 = local_4b8 + 1;
  limit2_3 = limit2_3 + 8;
  goto LAB_0012e8a0;
LAB_0012f997:
  local_980 = local_980 + 1;
  limit2_5 = limit2_5 + 8;
  goto LAB_0012f935;
LAB_0012fef3:
  local_9c0 = local_9c0 + 1;
  limit2_6 = limit2_6 + 8;
  goto LAB_0012fe91;
LAB_0012f58b:
  local_1e8 = local_1e8 + 1;
  limit2_4 = limit2_4 + 8;
  goto LAB_0012f529;
LAB_001304d7:
  local_800 = local_800 + 1;
  limit2_7 = limit2_7 + 8;
  goto LAB_00130475;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals,
    const BackwardReferenceFromDecoder* backward_references,
    size_t* back_refs_position, size_t back_refs_size) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = 0;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  BROTLI_UNUSED(literal_context_lut);

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    sr.used_stored = BROTLI_FALSE;
    FN(FindLongestMatch)(privat, &params->dictionary,
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance,
        backward_references, back_refs_position, back_refs_size, &sr);
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      /* If a reference from backward_references array was found
         then just take it */
      if (!sr.used_stored) {
          for (;; --max_length) {
            const score_t cost_diff_lazy = 175;
            HasherSearchResult sr2;
            sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
                BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
            sr2.len_code_delta = 0;
            sr2.distance = 0;
            sr2.score = kMinScore;
            sr2.used_stored = BROTLI_FALSE;
            max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
            dictionary_start = BROTLI_MIN(size_t,
                position + 1 + position_offset, max_backward_limit);
            FN(FindLongestMatch)(privat,
                &params->dictionary,
                ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
                max_distance, dictionary_start + gap, params->dist.max_distance,
                backward_references, back_refs_position, back_refs_size, &sr2);
            if (sr2.score >= sr.score + cost_diff_lazy || sr2.used_stored) {
              /* Ok, let's just write one byte for now and start a match from the
                 next byte. */
              ++position;
              ++insert_length;
              sr = sr2;
              /* If a reference from backward_references array was found
                 then just take it */
              if (sr2.used_stored) {
                ++delayed_backward_references_in_row;
                break;
              }
              if (++delayed_backward_references_in_row < 4 &&
                  position + FN(HashTypeLength)() < pos_end) {
                continue;
              }
            }
            break;
          }
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics && back_refs_size == 0) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}